

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupTopAnd(Gia_Man_t *p,int fVerbose)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_00;
  int iIter;
  int fContinue;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  pTemp = Gia_ManDupNormalize(p,0);
  bVar1 = true;
  while (bVar1) {
    p_00 = Gia_ManDupTopAnd_iter(pTemp,fVerbose);
    iVar2 = Gia_ManCoNum(p_00);
    iVar3 = Gia_ManCoNum(pTemp);
    if (iVar2 == iVar3) {
      iVar2 = Gia_ManAndNum(p_00);
      iVar3 = Gia_ManAndNum(pTemp);
      if (iVar2 == iVar3) {
        bVar1 = false;
      }
    }
    Gia_ManStop(pTemp);
    pTemp = p_00;
    if (fVerbose != 0) {
      printf("Iter %2d : ");
      Gia_ManPrintStatsShort(p_00);
    }
  }
  return pTemp;
}

Assistant:

Gia_Man_t * Gia_ManDupTopAnd( Gia_Man_t * p, int fVerbose )  
{
    Gia_Man_t * pNew, * pTemp;
    int fContinue, iIter = 0;
    pNew = Gia_ManDupNormalize( p, 0 );
    for ( fContinue = 1; fContinue; )
    {
        pNew = Gia_ManDupTopAnd_iter( pTemp = pNew, fVerbose );
        if ( Gia_ManCoNum(pNew) == Gia_ManCoNum(pTemp) && Gia_ManAndNum(pNew) == Gia_ManAndNum(pTemp) )
            fContinue = 0;
        Gia_ManStop( pTemp );
        if ( fVerbose )
        {
            printf( "Iter %2d : ", ++iIter );
            Gia_ManPrintStatsShort( pNew );
        }
    }
    return pNew;
}